

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O3

int ecp_randomize_mxz(mbedtls_ecp_group *grp,mbedtls_ecp_point *P,
                     _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  size_t sVar1;
  int iVar2;
  int iVar3;
  mbedtls_mpi *X;
  mbedtls_mpi l;
  mbedtls_mpi local_48;
  
  sVar1 = grp->pbits;
  mbedtls_mpi_init(&local_48);
  iVar3 = 0;
  do {
    mbedtls_mpi_fill_random(&local_48,sVar1 + 7 >> 3,f_rng,p_rng);
    while (iVar2 = mbedtls_mpi_cmp_mpi(&local_48,&grp->P), -1 < iVar2) {
      iVar2 = mbedtls_mpi_shift_r(&local_48,1);
      if (iVar2 != 0) goto LAB_001314b1;
    }
    if (iVar3 == 0xb) {
      return -0x4d00;
    }
    iVar3 = iVar3 + 1;
    iVar2 = mbedtls_mpi_cmp_int(&local_48,1);
  } while (iVar2 < 1);
  iVar2 = mbedtls_mpi_mul_mpi(&P->X,&P->X,&local_48);
  if ((iVar2 == 0) && (iVar2 = ecp_modp(&P->X,grp), iVar2 == 0)) {
    mul_count = mul_count + 1;
    X = &P->Z;
    iVar2 = mbedtls_mpi_mul_mpi(X,X,&local_48);
    if ((iVar2 == 0) && (iVar2 = ecp_modp(X,grp), iVar2 == 0)) {
      mul_count = mul_count + 1;
      iVar2 = 0;
    }
  }
LAB_001314b1:
  mbedtls_mpi_free(&local_48);
  return iVar2;
}

Assistant:

static int ecp_randomize_mxz( const mbedtls_ecp_group *grp, mbedtls_ecp_point *P,
                int (*f_rng)(void *, unsigned char *, size_t), void *p_rng )
{
    int ret;
    mbedtls_mpi l;
    size_t p_size = ( grp->pbits + 7 ) / 8;
    int count = 0;

    mbedtls_mpi_init( &l );

    /* Generate l such that 1 < l < p */
    do
    {
        mbedtls_mpi_fill_random( &l, p_size, f_rng, p_rng );

        while( mbedtls_mpi_cmp_mpi( &l, &grp->P ) >= 0 )
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &l, 1 ) );

        if( count++ > 10 )
            return( MBEDTLS_ERR_ECP_RANDOM_FAILED );
    }
    while( mbedtls_mpi_cmp_int( &l, 1 ) <= 0 );

    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &P->X, &P->X, &l ) ); MOD_MUL( P->X );
    MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &P->Z, &P->Z, &l ) ); MOD_MUL( P->Z );

cleanup:
    mbedtls_mpi_free( &l );

    return( ret );
}